

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

float linb::any_cast<float>(any *operand)

{
  float *pfVar1;
  bad_any_cast *this;
  float *p;
  any *operand_local;
  
  pfVar1 = any_cast<float>(operand);
  if (pfVar1 == (float *)0x0) {
    this = (bad_any_cast *)__cxa_allocate_exception(8);
    memset(this,0,8);
    bad_any_cast::bad_any_cast(this);
    __cxa_throw(this,&bad_any_cast::typeinfo,bad_any_cast::~bad_any_cast);
  }
  return *pfVar1;
}

Assistant:

inline ValueType any_cast(any& operand)
{
    auto p = any_cast<typename std::remove_reference<ValueType>::type>(&operand);
#ifndef ANY_IMPL_NO_EXCEPTIONS
    if(p == nullptr) throw bad_any_cast();
#endif
    return *p;
}